

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O1

void __thiscall
license::EventRegistry::addEvent
          (EventRegistry *this,LCC_EVENT_TYPE_conflict event,char *licenseLocationId,char *info)

{
  pointer_conflict *ppaVar1;
  char *__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  iterator __position;
  pointer_conflict paVar4;
  pointer_conflict paVar5;
  size_t sVar6;
  mapped_type_conflict *pmVar7;
  iterator iVar8;
  long lVar9;
  long lVar10;
  AuditEvent_conflict audit;
  key_type local_558;
  anon_struct_1288_4_4db92441 local_538;
  
  lVar9 = 0x4cc300;
  if (PROGRESS_BY_EVENT_TYPE._16_8_ != 0) {
    lVar9 = 0x4cc300;
    lVar10 = PROGRESS_BY_EVENT_TYPE._16_8_;
    do {
      if ((int)event <= *(int *)(lVar10 + 0x20)) {
        lVar9 = lVar10;
      }
      lVar10 = *(long *)(lVar10 + 0x10 + (ulong)(*(int *)(lVar10 + 0x20) < (int)event) * 8);
    } while (lVar10 != 0);
  }
  lVar10 = 0x4cc300;
  if ((lVar9 != 0x4cc300) && (lVar10 = 0x4cc300, *(int *)(lVar9 + 0x20) <= (int)event)) {
    lVar10 = lVar9;
  }
  __dest = local_538.license_reference;
  local_538.severity = (LCC_SEVERITY)(lVar10 == 0x4cc300);
  local_538.event_type = event;
  if (licenseLocationId == (char *)0x0) {
    builtin_strncpy(local_538.license_reference,"UNDEF",6);
  }
  else {
    strncpy(__dest,licenseLocationId,0x400);
  }
  if (info == (char *)0x0) {
    local_538.param2[0] = '\0';
  }
  else {
    strncpy(local_538.param2,info,0xff);
  }
  __position._M_current =
       (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<AuditEvent,std::allocator<AuditEvent>>::_M_realloc_insert<AuditEvent_const&>
              ((vector<AuditEvent,std::allocator<AuditEvent>> *)this,__position,&local_538);
  }
  else {
    memcpy(__position._M_current,&local_538,0x508);
    ppaVar1 = &(this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  if (lVar10 == 0x4cc300) {
    paVar2 = &local_558.field_2;
    local_558._M_dataplus._M_p = (pointer)paVar2;
    sVar6 = strlen(__dest);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,__dest,local_538.license_reference + sVar6);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(&(this->mostAdvancedLogIdx_by_LicenseId)._M_t,&local_558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar2) {
      operator_delete(local_558._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar8._M_node ==
        &(this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    paVar4 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar5 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_558._M_dataplus._M_p = (pointer)paVar2;
    sVar6 = strlen(__dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,__dest,__dest + sVar6);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mostAdvancedLogIdx_by_LicenseId,&local_558);
    *pmVar7 = ((long)paVar4 - (long)paVar5 >> 3) * -0x65c393e032e1c9f - 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p == paVar2) {
      return;
    }
  }
  else {
    iVar3 = *(int *)(lVar10 + 0x24);
    if (this->current_validation_step < iVar3) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::clear(&(this->mostAdvancedLogIdx_by_LicenseId)._M_t);
      this->current_validation_step = iVar3;
    }
    if (iVar3 != this->current_validation_step) {
      return;
    }
    paVar4 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar5 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    sVar6 = strlen(local_538.license_reference);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,local_538.license_reference,local_538.license_reference + sVar6)
    ;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mostAdvancedLogIdx_by_LicenseId,&local_558);
    *pmVar7 = ((long)paVar4 - (long)paVar5 >> 3) * -0x65c393e032e1c9f - 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p == &local_558.field_2) {
      return;
    }
  }
  operator_delete(local_558._M_dataplus._M_p);
  return;
}

Assistant:

void EventRegistry::addEvent(LCC_EVENT_TYPE event, const char *licenseLocationId, const char *info) {
	AuditEvent audit;
	auto eventIterator = PROGRESS_BY_EVENT_TYPE.find(event);
	bool successEvent = (eventIterator != PROGRESS_BY_EVENT_TYPE.end());
	audit.severity = successEvent ? SVRT_INFO : SVRT_WARN;
	audit.event_type = event;
	if (licenseLocationId == nullptr) {
		strcpy(audit.license_reference, LIC_ID_NOT_DEFINED);
	} else {
		strncpy(audit.license_reference, licenseLocationId, MAX_PATH);
	}
	if (info == nullptr) {
		audit.param2[0] = '\0';
	} else {
		strncpy(audit.param2, info, 255);
	}
	logs.push_back(audit);
	// udpate the status of the log
	if (successEvent) {
		int step = eventIterator->second;
		if (step > current_validation_step) {
			mostAdvancedLogIdx_by_LicenseId.clear();
			current_validation_step = step;
		}

		if (step == current_validation_step) {
			mostAdvancedLogIdx_by_LicenseId[audit.license_reference] = logs.size() - 1;
		}
	} else if (mostAdvancedLogIdx_by_LicenseId.find(audit.license_reference) != mostAdvancedLogIdx_by_LicenseId.end()) {
		mostAdvancedLogIdx_by_LicenseId[audit.license_reference] = logs.size() - 1;
	}
}